

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

Layer * ncnn::ConvolutionDepthWise_layer_creator(void)

{
  Layer *this;
  
  this = (Layer *)operator_new(0x1d0);
  Layer::Layer(this);
  this->_vptr_Layer = (_func_int **)&PTR__ConvolutionDepthWise_00145d68;
  memset(&this[1].name._M_string_length,0,0xe0);
  this[3].type.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[3].type.field_2 + 8) = 0;
  this[3].name._M_dataplus._M_p = (pointer)0x0;
  this[3].name._M_string_length = 0;
  this[3].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[3].name.field_2 + 8) = 0;
  this->one_blob_only = true;
  this->support_inplace = false;
  return this;
}

Assistant:

ConvolutionDepthWise::ConvolutionDepthWise()
{
    one_blob_only = true;
    support_inplace = false;
}